

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::detail::ResultBuilder::binary_assert<0,std::optional<int>,std::nullopt_t>
          (ResultBuilder *this,optional<int> *lhs,nullopt_t *rhs)

{
  bool bVar1;
  ContextOptions *pCVar2;
  nullopt_t *in_R8;
  String SStack_38;
  
  bVar1 = (lhs->super__Optional_base<int,_true,_true>)._M_payload.super__Optional_payload_base<int>.
          _M_engaged;
  (this->super_AssertData).m_failed = bVar1;
  if ((bVar1 == false) && (pCVar2 = getContextOptions(), pCVar2->success != true)) {
    return;
  }
  stringifyBinaryExpr<std::optional<int>,std::nullopt_t>
            (&SStack_38,(detail *)lhs,(optional<int> *)0x1bc83a,(char *)rhs,in_R8);
  String::operator=(&(this->super_AssertData).m_decomp,&SStack_38);
  String::~String(&SStack_38);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }